

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUnicodeString.cpp
# Opt level: O0

filepos_t __thiscall
libebml::EbmlUnicodeString::RenderData
          (EbmlUnicodeString *this,IOCallback *output,bool param_2,bool param_3)

{
  void *pvVar1;
  uint64 uVar2;
  binary *Pad;
  uint32 Result;
  bool param_3_local;
  bool param_2_local;
  IOCallback *output_local;
  EbmlUnicodeString *this_local;
  
  UTFstring::GetUTF8_abi_cxx11_(&this->Value);
  Pad._0_4_ = std::__cxx11::string::length();
  if ((uint)Pad != 0) {
    UTFstring::GetUTF8_abi_cxx11_(&this->Value);
    pvVar1 = (void *)std::__cxx11::string::c_str();
    IOCallback::writeFully(output,pvVar1,(ulong)(uint)Pad);
  }
  uVar2 = EbmlElement::GetDefaultSize(&this->super_EbmlElement);
  if ((uint)Pad < uVar2) {
    uVar2 = EbmlElement::GetDefaultSize(&this->super_EbmlElement);
    pvVar1 = operator_new__(uVar2 - (uint)Pad,(nothrow_t *)&std::nothrow);
    if (pvVar1 != (void *)0x0) {
      uVar2 = EbmlElement::GetDefaultSize(&this->super_EbmlElement);
      memset(pvVar1,0,uVar2 - (uint)Pad);
      uVar2 = EbmlElement::GetDefaultSize(&this->super_EbmlElement);
      IOCallback::writeFully(output,pvVar1,uVar2 - (uint)Pad);
      uVar2 = EbmlElement::GetDefaultSize(&this->super_EbmlElement);
      Pad._0_4_ = (uint)uVar2;
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
    }
  }
  return (ulong)(uint)Pad;
}

Assistant:

filepos_t EbmlUnicodeString::RenderData(IOCallback & output, bool /* bForceRender */, bool /* bWithDefault */)
{
  uint32 Result = Value.GetUTF8().length();

  if (Result != 0) {
    output.writeFully(Value.GetUTF8().c_str(), Result);
  }

  if (Result < GetDefaultSize()) {
    // pad the rest with 0
    binary *Pad = new (std::nothrow) binary[GetDefaultSize() - Result];
    if (Pad != NULL) {
      memset(Pad, 0x00, GetDefaultSize() - Result);
      output.writeFully(Pad, GetDefaultSize() - Result);

      Result = GetDefaultSize();
      delete [] Pad;
    }
  }

  return Result;
}